

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

int Cbs_ManSolve(Cbs_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int local_1c;
  int RetValue;
  Gia_Obj_t *pObj_local;
  Cbs_Man_t *p_local;
  
  local_1c = 0;
  s_Counter = 0;
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3b7,"int Cbs_ManSolve(Cbs_Man_t *, Gia_Obj_t *)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3b8,"int Cbs_ManSolve(Cbs_Man_t *, Gia_Obj_t *)");
  }
  if (((p->pClauses).iHead != 1) || ((p->pClauses).iTail != 1)) {
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3b9,"int Cbs_ManSolve(Cbs_Man_t *, Gia_Obj_t *)");
  }
  (p->Pars).nBTThisNc = 0;
  (p->Pars).nJustThis = 0;
  (p->Pars).nBTThis = 0;
  Cbs_ManAssign(p,pObj,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
  iVar1 = Cbs_ManSolve_rec(p,0);
  if (iVar1 == 0) {
    iVar1 = Cbs_ManCheckLimits(p);
    if (iVar1 == 0) {
      Cbs_ManSaveModel(p,p->vModel);
      goto LAB_00920623;
    }
  }
  local_1c = 1;
LAB_00920623:
  Cbs_ManCancelUntil(p,0);
  (p->pJust).iTail = 0;
  (p->pJust).iHead = 0;
  (p->pClauses).iTail = 1;
  (p->pClauses).iHead = 1;
  (p->Pars).nBTTotal = (p->Pars).nBTThis + (p->Pars).nBTTotal;
  iVar1 = Abc_MaxInt((p->Pars).nJustTotal,(p->Pars).nJustThis);
  (p->Pars).nJustTotal = iVar1;
  iVar1 = Cbs_ManCheckLimits(p);
  if (iVar1 != 0) {
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

int Cbs_ManSolve( Cbs_Man_t * p, Gia_Obj_t * pObj )
{
    int RetValue = 0;
    s_Counter = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs_ManAssign( p, pObj, 0, NULL, NULL );
    if ( !Cbs_ManSolve_rec(p, 0) && !Cbs_ManCheckLimits(p) )
        Cbs_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Cbs_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs_ManCheckLimits( p ) )
        RetValue = -1;
//    printf( "%d ", s_Counter );
    return RetValue;
}